

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpack.c
# Opt level: O3

int fp_get_param(int argc,char **argv,fpstate *fpptr)

{
  byte bVar1;
  char cVar2;
  ushort *puVar3;
  double dVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  size_t sVar11;
  ushort **ppuVar12;
  long lVar13;
  int iVar14;
  char *pcVar15;
  bool bVar16;
  char tile [513];
  char tmp [513];
  long local_470;
  int local_464;
  char local_448 [512];
  undefined1 local_248;
  char local_238 [520];
  
  if (fpptr->initialized == 0x2a) {
    local_448[0] = '\0';
    if (argc < 2) {
      iVar14 = 1;
      bVar6 = true;
      bVar16 = true;
      bVar5 = false;
LAB_00103ef9:
      if (((fpptr->scale == 0.0) && (!NAN(fpptr->scale))) ||
         ((fpptr->comptype == 0x29 || (fpptr->test_all == 1)))) {
        if ((fpptr->quantize_level != 0.0) || (NAN(fpptr->quantize_level))) {
LAB_00103f44:
          if (bVar16) {
            if (!bVar6) {
              sVar11 = strlen(local_448);
              local_470 = 0;
              iVar9 = 0;
              do {
                if ((int)sVar11 <= iVar9) goto LAB_0010405f;
                ppuVar12 = __ctype_b_loc();
                puVar3 = *ppuVar12;
                lVar13 = (long)iVar9;
                iVar9 = iVar9 + -1;
                pcVar15 = local_448 + lVar13;
                while( true ) {
                  cVar2 = local_448[lVar13];
                  if (((long)cVar2 != 0x2c) && ((puVar3[cVar2] & 0x800) == 0)) {
                    fp_msg("Error: `-t\' requires comma separated tile dims, ");
                    pcVar15 = "e.g., `-t 100,100\'\n";
                    goto LAB_001040b5;
                  }
                  if (cVar2 != ',') break;
                  lVar13 = lVar13 + 1;
                  iVar9 = iVar9 + 1;
                  pcVar15 = pcVar15 + 1;
                  if ((int)sVar11 == lVar13) goto LAB_0010405f;
                }
                lVar13 = atol(local_448 + lVar13);
                fpptr->ntile[local_470] = lVar13;
                do {
                  cVar2 = *pcVar15;
                  iVar9 = iVar9 + 1;
                  pcVar15 = pcVar15 + 1;
                } while ((*(byte *)((long)puVar3 + (long)cVar2 * 2 + 1) & 8) != 0);
                local_470 = local_470 + 1;
              } while (local_470 != 7);
              fp_msg("Error: too many dimensions for `-t\', max=");
              pcVar15 = local_238;
              snprintf(pcVar15,0x201,"%d\n",6);
              goto LAB_001040b5;
            }
          }
          else {
            *(undefined4 *)(fpptr->ntile + 4) = 0xffffffff;
            *(undefined4 *)((long)fpptr->ntile + 0x24) = 0xffffffff;
            *(undefined4 *)(fpptr->ntile + 5) = 0xffffffff;
            *(undefined4 *)((long)fpptr->ntile + 0x2c) = 0xffffffff;
            *(undefined4 *)(fpptr->ntile + 2) = 0xffffffff;
            *(undefined4 *)((long)fpptr->ntile + 0x14) = 0xffffffff;
            *(undefined4 *)(fpptr->ntile + 3) = 0xffffffff;
            *(undefined4 *)((long)fpptr->ntile + 0x1c) = 0xffffffff;
            *(undefined4 *)fpptr->ntile = 0xffffffff;
            *(undefined4 *)((long)fpptr->ntile + 4) = 0xffffffff;
            *(undefined4 *)(fpptr->ntile + 1) = 0xffffffff;
            *(undefined4 *)((long)fpptr->ntile + 0xc) = 0xffffffff;
          }
LAB_0010405f:
          if (bVar5) {
            fpptr->firstfile = iVar14;
            return 0;
          }
          pcVar15 = "Error: no FITS files to compress\n";
LAB_00104096:
          fp_msg(pcVar15);
LAB_0010409b:
          fp_usage();
          goto LAB_001040ba;
        }
        if (fpptr->comptype - 0x15U < 2) {
          if (fpptr->int_to_float != 1) goto LAB_00103f44;
          pcVar15 = "Error: `-q 0\' not allowed with -i2f\n";
        }
        else {
          pcVar15 = "Error: `-q 0\' only allowed with GZIP\n";
        }
      }
      else {
        pcVar15 = "Error: `-s\' requires `-h or -T\'\n";
      }
    }
    else {
      bVar7 = false;
      iVar14 = 1;
      bVar8 = false;
      bVar16 = false;
      local_464 = 0;
      bVar6 = false;
      do {
        pcVar15 = argv[iVar14];
        if (((*pcVar15 != '-') ||
            (((((sVar11 = strlen(pcVar15), sVar11 != 2 && (pcVar15[1] != 'q')) &&
               ((pcVar15[1] != 'q' || (pcVar15[2] != 'z')))) &&
              ((pcVar15[1] != 'g' || (pcVar15[2] != '1')))) &&
             ((pcVar15[1] != 'g' || (pcVar15[2] != '2')))))) &&
           ((((iVar9 = strncmp(pcVar15,"-i2f",4), iVar9 != 0 &&
              (iVar9 = strncmp(pcVar15,"-n3ratio",8), iVar9 != 0)) &&
             (iVar9 = strncmp(pcVar15,"-n3min",6), iVar9 != 0)) &&
            ((iVar9 = strncmp(pcVar15,"-tableonly",10), iVar9 != 0 &&
             (iVar9 = strncmp(pcVar15,"-table",6), iVar9 != 0)))))) {
          bVar5 = true;
          goto LAB_00103eb4;
        }
        bVar1 = pcVar15[1];
        if (0x67 < bVar1) {
          if (bVar1 == 0x68) {
            fpptr->comptype = 0x29;
          }
          else if (bVar1 == 0x70) {
            fpptr->comptype = 0x1f;
          }
          else {
            if (bVar1 != 0x72) goto LAB_00103a7a;
            fpptr->comptype = 0xb;
          }
LAB_00103a58:
          bVar5 = !bVar16;
          bVar16 = true;
          if (bVar5) goto LAB_00103a69;
          pcVar15 = "Error: multiple compression flags\n";
          goto LAB_00104096;
        }
        if (bVar1 == 100) {
          fpptr->comptype = -1;
          goto LAB_00103a58;
        }
        if (bVar1 == 0x67) {
          fpptr->comptype = (pcVar15[2] == '2') + 0x15;
          goto LAB_00103a58;
        }
LAB_00103a7a:
        iVar9 = strcmp(pcVar15,"-i2f");
        if (iVar9 == 0) {
          fpptr->int_to_float = 1;
          goto LAB_00103a69;
        }
        iVar9 = strcmp(pcVar15,"-n3ratio");
        if (iVar9 == 0) {
          iVar14 = iVar14 + 1;
          if (iVar14 < argc) {
            dVar4 = atof(argv[iVar14]);
            fpptr->n3ratio = (float)dVar4;
            goto LAB_00103a69;
          }
          goto LAB_0010409b;
        }
        iVar9 = strcmp(pcVar15,"-n3min");
        if (iVar9 == 0) {
          iVar14 = iVar14 + 1;
          if (iVar14 < argc) {
            dVar4 = atof(argv[iVar14]);
            fpptr->n3min = (float)dVar4;
            goto LAB_00103a69;
          }
          goto LAB_0010409b;
        }
        if (bVar1 == 0x6e) {
          iVar14 = iVar14 + 1;
          if (iVar14 < argc) {
            dVar4 = atof(argv[iVar14]);
            fpptr->rescale_noise = (float)dVar4;
            goto LAB_00103a69;
          }
          goto LAB_0010409b;
        }
        if (bVar1 == 0x73) {
          iVar14 = iVar14 + 1;
          if (iVar14 < argc) {
            dVar4 = atof(argv[iVar14]);
            fpptr->scale = (float)dVar4;
            goto LAB_00103a69;
          }
          goto LAB_0010409b;
        }
        if (bVar1 == 0x71) {
          cVar2 = pcVar15[2];
          if (cVar2 == 't') {
            fpptr->dither_offset = -1;
          }
          else if (cVar2 == 'z') {
            fpptr->dither_method = 2;
            cVar2 = pcVar15[3];
            if ((long)cVar2 == 0x74) {
              fpptr->dither_offset = -1;
            }
            else {
              ppuVar12 = __ctype_b_loc();
              if ((*(byte *)((long)*ppuVar12 + (long)cVar2 * 2 + 1) & 8) != 0) {
                pcVar15 = pcVar15 + 3;
                goto LAB_00103cff;
              }
            }
          }
          else {
            ppuVar12 = __ctype_b_loc();
            if ((*(byte *)((long)*ppuVar12 + (long)cVar2 * 2 + 1) & 8) != 0) {
              pcVar15 = pcVar15 + 2;
LAB_00103cff:
              uVar10 = atoi(pcVar15);
              if (uVar10 == 0) {
                fpptr->no_dither = 1;
              }
              else {
                if (10000 < uVar10) {
                  pcVar15 = "Error: invalid q suffix\n";
                  goto LAB_00104096;
                }
                fpptr->dither_offset = uVar10;
              }
            }
          }
          iVar14 = iVar14 + 1;
          if (iVar14 < argc) {
            dVar4 = atof(argv[iVar14]);
            fpptr->quantize_level = (float)dVar4;
            goto LAB_00103a69;
          }
          goto LAB_0010409b;
        }
        iVar9 = strcmp(pcVar15,"-tableonly");
        if (iVar9 == 0) {
          fp_get_param_cold_2();
          goto LAB_00103a69;
        }
        iVar9 = strcmp(pcVar15,"-table");
        if (iVar9 == 0) {
          fp_get_param_cold_1();
          goto LAB_00103a69;
        }
        if (0x73 < bVar1) {
          if (bVar1 == 0x77) {
            if (bVar6) {
LAB_00104103:
              pcVar15 = "Error: multiple tile specifications\n";
              goto LAB_00104096;
            }
            local_464 = local_464 + 1;
          }
          else {
            if (bVar1 == 0x76) {
              fpptr->verbose = 1;
              goto LAB_00103a69;
            }
            if (bVar1 != 0x74) goto switchD_00103c44_caseD_45;
            if (bVar6) goto LAB_00104103;
            iVar14 = iVar14 + 1;
            if (argc <= iVar14) goto LAB_0010409b;
            strncpy(local_448,argv[iVar14],0x200);
            local_248 = 0;
          }
          bVar6 = true;
          goto LAB_00103a69;
        }
        switch(bVar1) {
        case 0x43:
          fpptr->do_checksums = 0;
          break;
        case 0x44:
          fpptr->delete_input = fpptr->delete_input + 1;
          break;
        default:
switchD_00103c44_caseD_45:
          fp_msg("Error: unknown command line flag `");
          fp_msg(argv[iVar14]);
          fp_msg("\'\n");
LAB_00104163:
          fp_usage();
          fp_hint();
          goto LAB_001040ba;
        case 0x46:
          fpptr->clobber = fpptr->clobber + 1;
          break;
        case 0x48:
          fp_help();
          goto LAB_0010412a;
        case 0x4c:
          fpptr->listonly = fpptr->listonly + 1;
          break;
        case 0x4f:
          if (bVar8) {
            pcVar15 = "Error: -O option is not allowed with -R\n";
            goto LAB_001040b5;
          }
          iVar14 = iVar14 + 1;
          if (argc <= iVar14) goto LAB_00104163;
          strncpy(fpptr->outfile,argv[iVar14],0x200);
          fpptr->outfile[0x200] = '\0';
          bVar7 = true;
          bVar8 = false;
          break;
        case 0x52:
          if (bVar7) {
            pcVar15 = "Error: -R option is not allowed with -O\n";
            goto LAB_001040b5;
          }
          iVar14 = iVar14 + 1;
          if (argc <= iVar14) goto LAB_00104163;
          strncpy(fpptr->outfile,argv[iVar14],0x200);
          fpptr->outfile[0x200] = '\0';
          bVar7 = false;
          bVar8 = true;
          break;
        case 0x53:
          fpptr->to_stdout = fpptr->to_stdout + 1;
          break;
        case 0x54:
          fpptr->test_all = 1;
          break;
        case 0x56:
          fp_version();
LAB_0010412a:
          exit(0);
        case 0x59:
          fpptr->do_not_prompt = fpptr->do_not_prompt + 1;
        }
LAB_00103a69:
        iVar14 = iVar14 + 1;
      } while (iVar14 < argc);
      bVar5 = false;
LAB_00103eb4:
      bVar16 = local_464 == 0;
      bVar6 = !bVar6;
      if ((bVar8) && (fpptr->test_all == 0)) {
        pcVar15 = "Error: -R option may only be used with -T\n";
      }
      else {
        if ((!bVar7) || ((fpptr->test_all == 0 && (fpptr->to_stdout == 0)))) goto LAB_00103ef9;
        pcVar15 = "Error: -O option may not be used with -S or -T\n";
      }
    }
  }
  else {
    pcVar15 = "Error: internal initialization error\n";
  }
LAB_001040b5:
  fp_msg(pcVar15);
LAB_001040ba:
  exit(-1);
}

Assistant:

int fp_get_param (int argc, char *argv[], fpstate *fpptr)
{
	int	gottype=0, gottile=0, wholetile=0, iarg, len, ndim, ii, doffset;
        int     gotR=0, gotO=0;
	char	tmp[SZ_STR], tile[SZ_STR];

        if (fpptr->initialized != FP_INIT_MAGIC) {
            fp_msg ("Error: internal initialization error\n"); exit (-1);
        }

	tile[0] = 0;

	/* flags must come first and be separately specified
	 */
	for (iarg = 1; iarg < argc; iarg++) {
	    if ((argv[iarg][0] == '-' && strlen (argv[iarg]) == 2) ||
	        !strncmp(argv[iarg], "-q", 2) || !strncmp(argv[iarg], "-qz", 3) ||
	        !strncmp(argv[iarg], "-g1", 3) || !strncmp(argv[iarg], "-g2", 3) ||
	        !strncmp(argv[iarg], "-i2f", 4) ||
	        !strncmp(argv[iarg], "-n3ratio", 8) || !strncmp(argv[iarg], "-n3min", 6) ||
	        !strncmp(argv[iarg], "-tableonly", 10) || !strncmp(argv[iarg], "-table", 6) )  
	    {

		/* Rice is the default, so -r is superfluous  */
		if (       argv[iarg][1] == 'r') {
		    fpptr->comptype = RICE_1;
		    if (gottype) {
			fp_msg ("Error: multiple compression flags\n");
			fp_usage (); exit (-1);
		    } else
			gottype++;

		} else if (argv[iarg][1] == 'p') {
		    fpptr->comptype = PLIO_1;
		    if (gottype) {
			fp_msg ("Error: multiple compression flags\n");
			fp_usage (); exit (-1);
		    } else
			gottype++;

		} else if (argv[iarg][1] == 'g') {
		    /* test for modifiers following the 'g' */
                    if (argv[iarg][2] == '2')
		        fpptr->comptype = GZIP_2;
		    else
		        fpptr->comptype = GZIP_1;

		    if (gottype) {
			fp_msg ("Error: multiple compression flags\n");
			fp_usage (); exit (-1);
		    } else
			gottype++;
/*
		} else if (argv[iarg][1] == 'b') {
		    fpptr->comptype = BZIP2_1;
		    if (gottype) {
			fp_msg ("Error: multiple compression flags\n");
			fp_usage (); exit (-1);
		    } else
			gottype++;
*/
		} else if (argv[iarg][1] == 'h') {
		    fpptr->comptype = HCOMPRESS_1;
		    if (gottype) {
			fp_msg ("Error: multiple compression flags\n");
			fp_usage (); exit (-1);
		    } else
			gottype++;

		} else if (argv[iarg][1] == 'd') {
		    fpptr->comptype = NOCOMPRESS;
		    if (gottype) {
			fp_msg ("Error: multiple compression flags\n");
			fp_usage (); exit (-1);
		    } else
			gottype++;

		} else if (!strcmp(argv[iarg], "-i2f")) {
		    /* this means convert integer images to float, and then */
		    /* quantize and compress the float image.  This lossy */
		    /* compression method may give higher compression than the */
		    /* lossless compression method that is usually applied to */
		    /* integer images. */
		    
		    fpptr->int_to_float = 1;

		} else if (!strcmp(argv[iarg], "-n3ratio")) {
		    /* this is the minimum ratio between the MAD noise sigma */
		    /* and the q parameter value in the case where the integer */
		    /* image is quantized and compressed like a float image. */
		    if (++iarg >= argc) {
			fp_usage (); exit (-1);
		    } else {
			fpptr->n3ratio = (float) atof (argv[iarg]);
		    }
		} else if (!strcmp(argv[iarg], "-n3min")) {
		    /* this is the minimum  MAD noise sigma in the case where the */
		    /* integer image is quantized and compressed like a float image. */
		    if (++iarg >= argc) {
			fp_usage (); exit (-1);
		    } else {
			fpptr->n3min = (float) atof (argv[iarg]);
		    }
		} else if (argv[iarg][1] == 'q') {
		    /* test for modifiers following the 'q' */

                    if (argv[iarg][2] == 'z') {
		        fpptr->dither_method = 2;  /* preserve zero pixels */

                        if (argv[iarg][3] == 't') {
		            fpptr->dither_offset = -1;  /* dither based on tile checksum */

                        } else if (isdigit(argv[iarg][3])) { /* is a number appended to q? */
		           doffset = atoi(argv[iarg]+3);

                           if (doffset == 0) {
		              fpptr->no_dither = 1;  /* don't dither the quantized values */
		           } else if (doffset > 0 && doffset <= 10000) {
		              fpptr->dither_offset = doffset;
		           } else {
			      fp_msg ("Error: invalid q suffix\n");
			      fp_usage (); exit (-1);
		           }
			}
		    } else {
                        if (argv[iarg][2] == 't') {
		            fpptr->dither_offset = -1;  /* dither based on tile checksum */

                        } else if (isdigit(argv[iarg][2])) { /* is a number appended to q? */
		           doffset = atoi(argv[iarg]+2);

                           if (doffset == 0) {
		              fpptr->no_dither = 1;  /* don't dither the quantized values */
		           } else if (doffset > 0 && doffset <= 10000) {
		              fpptr->dither_offset = doffset;
		           } else {
			      fp_msg ("Error: invalid q suffix\n");
			      fp_usage (); exit (-1);
		           }
			}
		    }

		    if (++iarg >= argc) {
			fp_usage (); exit (-1);
		    } else {
			fpptr->quantize_level = (float) atof (argv[iarg]);
		    }
		} else if (argv[iarg][1] == 'n') {
		    if (++iarg >= argc) {
			fp_usage (); exit (-1);
		    } else {
			fpptr->rescale_noise = (float) atof (argv[iarg]);
		    }
		} else if (argv[iarg][1] == 's') {
		    if (++iarg >= argc) {
			fp_usage (); exit (-1);
		    } else {
			fpptr->scale = (float) atof (argv[iarg]);
		    }
		} else if (!strcmp(argv[iarg], "-tableonly")) {
		    fpptr->do_tables = 1;
		    fpptr->do_images = 0;
                    /* Do not write this to stdout via fp_msg.  Otherwise it will be placed at start of piped FITS
                       file, which will then be corrupted. */
                    fprintf(stderr, "Note: The table compression method used by fpack has been\n");
		    fprintf(stderr, " officially approved as part of FITS format standard since 2016.\n");
		    fprintf(stderr, " However users should be aware that the compressed table files may\n");
		    fprintf(stderr, " only be readable by a limited number of applications (including fpack).\n");

		} else if (!strcmp(argv[iarg], "-table")) {
		    fpptr->do_tables = 1;
                    fprintf(stderr, "Note: The table compression method used by fpack has been\n");
		    fprintf(stderr, " officially approved as part of FITS format standard since 2016.\n");
		    fprintf(stderr, " However users should be aware that the compressed table files may\n");
		    fprintf(stderr, " only be readable by a limited number of applications (including fpack).\n");

		} else if (argv[iarg][1] == 't') {
		    if (gottile) {
			fp_msg ("Error: multiple tile specifications\n");
			fp_usage (); exit (-1);
		    } else
			gottile++;

		    if (++iarg >= argc) {
			fp_usage (); exit (-1);
		    } else {
			strncpy (tile, argv[iarg], SZ_STR-1); /* checked below */
                        tile[SZ_STR-1]=0;
                    }

		} else if (argv[iarg][1] == 'v') {
		    fpptr->verbose = 1;

		} else if (argv[iarg][1] == 'w') {
		    wholetile++;
		    if (gottile) {
			fp_msg ("Error: multiple tile specifications\n");
			fp_usage (); exit (-1);
		    } else
			gottile++;

		} else if (argv[iarg][1] == 'F') {
		    fpptr->clobber++;       /* overwrite existing file */

		} else if (argv[iarg][1] == 'D') {
		    fpptr->delete_input++;

		} else if (argv[iarg][1] == 'Y') {
		    fpptr->do_not_prompt++;

		} else if (argv[iarg][1] == 'S') {
		    fpptr->to_stdout++;

		} else if (argv[iarg][1] == 'L') {
		    fpptr->listonly++;

		} else if (argv[iarg][1] == 'C') {
		    fpptr->do_checksums = 0;

		} else if (argv[iarg][1] == 'T') {
		    fpptr->test_all = 1;

		} else if (argv[iarg][1] == 'R') {
                    if (gotO) {
                        fp_msg("Error: -R option is not allowed with -O\n");
                        exit(-1);
		    } else if (++iarg >= argc) {
			fp_usage (); fp_hint (); exit (-1);
		    } else {
			strncpy (fpptr->outfile, argv[iarg], SZ_STR-1);
                        fpptr->outfile[SZ_STR-1]=0;
                        gotR=1;
                    }

		} else if (argv[iarg][1] == 'H') {
		    fp_help (); exit (0);

		} else if (argv[iarg][1] == 'V') {
		    fp_version (); exit (0);
                    
                } else if (argv[iarg][1] == 'O') {
                    if (gotR) {
                        fp_msg("Error: -O option is not allowed with -R\n");
                        exit(-1);
		    } else if (++iarg >= argc) {
			fp_usage (); fp_hint (); exit (-1);
		    } else {
			strncpy (fpptr->outfile, argv[iarg], SZ_STR-1);
                        fpptr->outfile[SZ_STR-1]=0;
                        gotO=1;
                    }
                
		} else {
		    fp_msg ("Error: unknown command line flag `");
		    fp_msg (argv[iarg]); fp_msg ("'\n");
		    fp_usage (); fp_hint (); exit (-1);
		}

	    } else
		break;
	}

        /* In earlier loop, already made sure both -O and -R are not being used.
           This is essential, as each must store info in the same 'outfile' array. 
           Now do additional tests of -O and -R with other flags. */
        
        if (gotR && !fpptr->test_all) {
            fp_msg("Error: -R option may only be used with -T\n"); exit(-1);
        }
        
        if (gotO && (fpptr->test_all || fpptr->to_stdout)) {
            fp_msg("Error: -O option may not be used with -S or -T\n"); exit(-1);
        }
        
	if (fpptr->scale != 0. && 
	         fpptr->comptype != HCOMPRESS_1 && fpptr->test_all != 1) {

	    fp_msg ("Error: `-s' requires `-h or -T'\n"); exit (-1);
	}

	if (fpptr->quantize_level == 0) {
	
	    if ((fpptr->comptype != GZIP_1) && (fpptr->comptype != GZIP_2)) {
	        fp_msg ("Error: `-q 0' only allowed with GZIP\n"); exit (-1);
	    }

            if (fpptr->int_to_float == 1) {
	        fp_msg ("Error: `-q 0' not allowed with -i2f\n"); exit (-1);
	    }
	}

	if (wholetile) {
	    for (ndim=0; ndim < MAX_COMPRESS_DIM; ndim++)
		fpptr->ntile[ndim] = (long) -1;

	} else if (gottile) {
	    len = strlen (tile);
	    for (ii=0, ndim=0; ii < len; ) {
		if (! (isdigit (tile[ii]) || tile[ii] == ',')) {
		    fp_msg ("Error: `-t' requires comma separated tile dims, ");
		    fp_msg ("e.g., `-t 100,100'\n"); exit (-1);
		}

		if (tile[ii] == ',') { ii++; continue; }

		fpptr->ntile[ndim] = atol (&tile[ii]);
		for ( ; isdigit(tile[ii]); ii++);

		if (++ndim > MAX_COMPRESS_DIM) {
		    fp_msg ("Error: too many dimensions for `-t', max=");
		    snprintf (tmp, SZ_STR,"%d\n", MAX_COMPRESS_DIM); fp_msg (tmp);
		    exit (-1);
		}
	    }
	}

	if (iarg >= argc) {
	    fp_msg ("Error: no FITS files to compress\n");
	    fp_usage (); exit (-1);
	} else
	    fpptr->firstfile = iarg;

	return(0);
}